

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_hash.c
# Opt level: O0

ion_status_t linear_hash_update(ion_key_t key,ion_value_t value,linear_hash_table_t *linear_hash)

{
  ion_key_size_t iVar1;
  ion_dictionary_compare_t p_Var2;
  ion_key_t key_00;
  ion_value_t value_00;
  ion_fpos_t iVar3;
  ion_byte_t *piVar4;
  ion_byte_t *key_01;
  undefined8 bucket_loc_00;
  char cVar5;
  int hash_bucket_idx;
  ion_byte_t *piVar6;
  ion_status_t iVar7;
  ion_byte_t aiStack_90 [8];
  ion_key_t local_88;
  ion_value_t local_80;
  char local_75;
  int local_74;
  ion_boolean_t terminal;
  long lStack_70;
  int i;
  ion_fpos_t record_loc;
  ion_byte_t *piStack_60;
  ion_byte_t record_status;
  ion_byte_t *record_value;
  ion_byte_t *record_key;
  linear_hash_bucket_t bucket;
  ion_fpos_t bucket_loc;
  byte bStack_30;
  undefined7 uStack_2f;
  int bucket_idx;
  ion_status_t status;
  linear_hash_table_t *linear_hash_local;
  ion_value_t value_local;
  ion_key_t key_local;
  
  aiStack_90[0] = 0xcf;
  aiStack_90[1] = 0xd7;
  aiStack_90[2] = '\x10';
  aiStack_90[3] = '\0';
  aiStack_90[4] = '\0';
  aiStack_90[5] = '\0';
  aiStack_90[6] = '\0';
  aiStack_90[7] = '\0';
  bucket_loc._4_4_ = insert_hash_to_bucket((ion_byte_t *)key,linear_hash);
  if (bucket_loc._4_4_ < linear_hash->next_split) {
    aiStack_90[0] = 0xeb;
    aiStack_90[1] = 0xd7;
    aiStack_90[2] = '\x10';
    aiStack_90[3] = '\0';
    aiStack_90[4] = '\0';
    aiStack_90[5] = '\0';
    aiStack_90[6] = '\0';
    aiStack_90[7] = '\0';
    bucket_loc._4_4_ = hash_to_bucket((ion_byte_t *)key,linear_hash);
  }
  aiStack_90[0] = 0xfa;
  aiStack_90[1] = 0xd7;
  aiStack_90[2] = '\x10';
  aiStack_90[3] = '\0';
  aiStack_90[4] = '\0';
  aiStack_90[5] = '\0';
  aiStack_90[6] = '\0';
  aiStack_90[7] = '\0';
  bucket.overflow_location = bucket_idx_to_ion_fpos_t(bucket_loc._4_4_,linear_hash);
  aiStack_90[0] = '\x0f';
  aiStack_90[1] = 0xd8;
  aiStack_90[2] = '\x10';
  aiStack_90[3] = '\0';
  aiStack_90[4] = '\0';
  aiStack_90[5] = '\0';
  aiStack_90[6] = '\0';
  aiStack_90[7] = '\0';
  bStack_30 = linear_hash_get_bucket
                        (bucket.overflow_location,(linear_hash_bucket_t *)&record_key,linear_hash);
  uStack_2f = 0;
  if (bStack_30 == 0) {
    record_value = (ion_byte_t *)
                   ((long)&local_88 -
                   ((long)(linear_hash->super).record.key_size + 0xfU & 0xfffffffffffffff0));
    piVar6 = record_value +
             -((long)(linear_hash->super).record.value_size + 0xfU & 0xfffffffffffffff0);
    record_loc._7_1_ = '\0';
    local_75 = '\0';
    piStack_60 = piVar6;
    do {
      while( true ) {
        if (local_75 != '\0') {
          if (bucket_idx == 0) {
            local_88 = key;
            local_80 = value;
            piVar6[-8] = 0xbb;
            piVar6[-7] = 0xd9;
            piVar6[-6] = '\x10';
            piVar6[-5] = '\0';
            piVar6[-4] = '\0';
            piVar6[-3] = '\0';
            piVar6[-2] = '\0';
            piVar6[-1] = '\0';
            hash_bucket_idx = insert_hash_to_bucket((ion_byte_t *)key,linear_hash);
            value_00 = local_80;
            key_00 = local_88;
            piVar6[-8] = 0xce;
            piVar6[-7] = 0xd9;
            piVar6[-6] = '\x10';
            piVar6[-5] = '\0';
            piVar6[-4] = '\0';
            piVar6[-3] = '\0';
            piVar6[-2] = '\0';
            piVar6[-1] = '\0';
            iVar7 = linear_hash_insert(key_00,value_00,hash_bucket_idx,linear_hash);
            return iVar7;
          }
          _bStack_30 = (ion_status_t)((ulong)_bStack_30 & 0xffffffffffffff00);
          return _bStack_30;
        }
        lStack_70 = bucket.overflow_location + 0x10;
        for (local_74 = 0; iVar7 = _bStack_30, bucket_loc_00 = bucket._0_8_, key_01 = record_value,
            piVar4 = piStack_60, iVar3 = lStack_70, local_74 < linear_hash->records_per_bucket;
            local_74 = local_74 + 1) {
          piVar6[-8] = 0xb3;
          piVar6[-7] = 0xd8;
          piVar6[-6] = '\x10';
          piVar6[-5] = '\0';
          piVar6[-4] = '\0';
          piVar6[-3] = '\0';
          piVar6[-2] = '\0';
          piVar6[-1] = '\0';
          bStack_30 = linear_hash_get_record
                                (iVar3,key_01,piVar4,(ion_byte_t *)((long)&record_loc + 7),
                                 linear_hash);
          piVar4 = record_value;
          if (bStack_30 != '\0') {
            return _bStack_30;
          }
          if (record_loc._7_1_ == '\x01') {
            p_Var2 = (linear_hash->super).compare;
            iVar1 = (linear_hash->super).record.key_size;
            piVar6[-8] = 0xee;
            piVar6[-7] = 0xd8;
            piVar6[-6] = '\x10';
            piVar6[-5] = '\0';
            piVar6[-4] = '\0';
            piVar6[-3] = '\0';
            piVar6[-2] = '\0';
            piVar6[-1] = '\0';
            cVar5 = (*p_Var2)(piVar4,key,iVar1);
            piVar4 = record_value;
            iVar3 = lStack_70;
            if (cVar5 == '\0') {
              piVar6[-8] = '\x0f';
              piVar6[-7] = 0xd9;
              piVar6[-6] = '\x10';
              piVar6[-5] = '\0';
              piVar6[-4] = '\0';
              piVar6[-3] = '\0';
              piVar6[-2] = '\0';
              piVar6[-1] = '\0';
              bStack_30 = linear_hash_write_record
                                    (iVar3,piVar4,(ion_byte_t *)value,
                                     (ion_byte_t *)((long)&record_loc + 7),linear_hash);
              if (bStack_30 != '\0') {
                return _bStack_30;
              }
              bucket_idx = iVar7.count;
              _bStack_30 = (ion_status_t)((ulong)(bucket_idx + 1) << 0x20);
            }
          }
          lStack_70 = linear_hash->record_total_size + lStack_70;
        }
        if (bucket._0_8_ != -1) break;
        local_75 = '\x01';
      }
      bucket.overflow_location._0_4_ = bucket.idx;
      bucket.overflow_location._4_4_ = bucket.record_count;
      piVar6[-8] = 'w';
      piVar6[-7] = 0xd9;
      piVar6[-6] = '\x10';
      piVar6[-5] = '\0';
      piVar6[-4] = '\0';
      piVar6[-3] = '\0';
      piVar6[-2] = '\0';
      piVar6[-1] = '\0';
      bStack_30 = linear_hash_get_bucket
                            (bucket_loc_00,(linear_hash_bucket_t *)&record_key,linear_hash);
    } while (bStack_30 == '\0');
    key_local = (ion_key_t)_bStack_30;
  }
  else {
    key_local = (ion_key_t)_bStack_30;
  }
  return (ion_status_t)key_local;
}

Assistant:

ion_status_t
linear_hash_update(
	ion_key_t			key,
	ion_value_t			value,
	linear_hash_table_t *linear_hash
) {
	ion_status_t status = ION_STATUS_INITIALIZE;
	/* get the index of the bucket to read */
	int bucket_idx		= insert_hash_to_bucket(key, linear_hash);

	if (bucket_idx < linear_hash->next_split) {
		bucket_idx = hash_to_bucket(key, linear_hash);
	}

	/* get the bucket where the record would be located */
	ion_fpos_t				bucket_loc = bucket_idx_to_ion_fpos_t(bucket_idx, linear_hash);
	linear_hash_bucket_t	bucket;

	status.error = linear_hash_get_bucket(bucket_loc, &bucket, linear_hash);

	if (status.error != err_ok) {
		return status;
	}

	/* create a temporary store for records that are read */
	ion_byte_t	*record_key		= alloca(linear_hash->super.record.key_size);
	ion_byte_t	*record_value	= alloca(linear_hash->super.record.value_size);
	ion_byte_t	record_status	= linear_hash_record_status_empty;

	ion_fpos_t record_loc;

	int				i;
	ion_boolean_t	terminal = boolean_false;

	while (terminal == boolean_false) {
		record_loc = bucket_loc + sizeof(linear_hash_bucket_t);

		for (i = 0; i < linear_hash->records_per_bucket; i++) {
			status.error = linear_hash_get_record(record_loc, record_key, record_value, &record_status, linear_hash);

			if (status.error != err_ok) {
				return status;
			}

			if (record_status == linear_hash_record_status_full) {
				if (linear_hash->super.compare(record_key, key, linear_hash->super.record.key_size) == 0) {
					status.error = linear_hash_write_record(record_loc, record_key, value, &record_status, linear_hash);

					if (status.error != err_ok) {
						return status;
					}

					status.count++;
				}
			}

			record_loc += linear_hash->record_total_size;
		}

		if (bucket.overflow_location == linear_hash_end_of_list) {
			terminal = boolean_true;
		}
		else {
			bucket_loc		= bucket.overflow_location;
			status.error	= linear_hash_get_bucket(bucket_loc, &bucket, linear_hash);

			if (status.error != err_ok) {
				return status;
			}
		}
	}

	if (status.count == 0) {
		status.error = err_item_not_found;
		return linear_hash_insert(key, value, insert_hash_to_bucket(key, linear_hash), linear_hash);
	}
	else {
		status.error = err_ok;
	}

	return status;
}